

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O2

bool __thiscall pg::pm_less(pg *this,int *a,int *b,int k,int pl)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  
  uVar3 = (uint)b;
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    bVar4 = (byte)pl;
    if ((~((int)uVar3 >> 0x1f) & uVar3) == uVar5) goto LAB_00162a3d;
    pl = *(int *)(this + uVar5 * 4);
    uVar1 = a[uVar5];
    uVar2 = uVar5 + 1;
  } while (pl == uVar1);
  if (pl == 0xffffffff) {
    bVar4 = 1;
  }
  else if (uVar1 == 0xffffffff) {
    bVar4 = 0;
  }
  else if ((pl & 1U) == k) {
    bVar4 = pl < (int)uVar1 && (uVar1 & 1) == k;
  }
  else {
    bVar4 = (int)uVar1 < pl || (uVar1 & 1) == k;
  }
LAB_00162a3d:
  return (bool)((long)uVar5 < (long)(int)uVar3 & bVar4);
}

Assistant:

static bool
pm_less(int* a, int* b, int k, int pl)
{
    // remember: _ < 5 < 3 < 1 < 0 < 2 < 4 < 6 (even measures, solving for odd)
    // remember: _ < 6 < 4 < 2 < 0 < 1 < 3 < 5 (odd measures, solving for even)

    for (int i=0; i<k; i++) {
        // if equal, then continue with next
        if (a[i] == b[i]) continue;
        // cases where a[i] is _ or b[i] is _
        if (a[i] == -1) return true;
        if (b[i] == -1) return false;
        // case distinction based on parity
        const bool a_is_pl = (a[i]&1) == pl;
        const bool b_is_pl = (b[i]&1) == pl;
        if (a_is_pl) {
            if (b_is_pl) return a[i] < b[i];
            else return false;
        } else {
            if (b_is_pl) return true;
            else return a[i] > b[i];
        }
    }
    // they are equal, so not less...
    return false;
}